

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O0

PointLight * __thiscall
embree::SceneGraph::PointLight::transform(PointLight *this,AffineSpace3fa *space)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 *in_RDX;
  long in_RSI;
  PointLight *in_RDI;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  float *local_350;
  undefined1 *local_340;
  float local_334;
  undefined8 *local_330;
  float local_324;
  undefined8 *local_320;
  float local_314;
  undefined8 *local_310;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  float local_2f8;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  float local_2cc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float local_2ac;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 *local_298;
  undefined8 *local_288;
  undefined1 *local_280;
  undefined8 *local_278;
  undefined8 *local_270;
  undefined1 *local_268;
  undefined8 *local_258;
  undefined8 *local_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  undefined8 *local_210;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  undefined1 *local_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 *local_1d8;
  undefined8 *local_1d0;
  undefined8 *local_1c8;
  undefined8 *local_1c0;
  undefined8 *local_1b8;
  undefined8 *local_1b0;
  undefined8 *local_1a8;
  undefined8 *local_1a0;
  undefined8 *local_198;
  undefined8 *local_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  undefined8 *local_150;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined8 *local_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 *local_118;
  undefined8 *local_110;
  undefined8 *local_108;
  undefined8 *local_100;
  undefined8 *local_f8;
  undefined8 *local_f0;
  undefined8 *local_e8;
  undefined8 *local_e0;
  undefined8 *local_d8;
  undefined8 *local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  undefined8 *local_90;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined8 *local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  undefined8 local_38;
  undefined8 uStack_30;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_350 = (float *)(in_RSI + 0x10);
  local_340 = &stack0xfffffffffffffc28;
  local_334 = *local_350;
  local_330 = &local_368;
  local_238 = CONCAT44(local_334,local_334);
  uStack_230 = CONCAT44(local_334,local_334);
  local_324 = *(float *)(in_RSI + 0x14);
  local_320 = &local_388;
  local_178 = CONCAT44(local_324,local_324);
  uStack_170 = CONCAT44(local_324,local_324);
  local_1d0 = in_RDX + 2;
  local_314 = *(float *)(in_RSI + 0x18);
  local_310 = &local_3a8;
  local_b8 = CONCAT44(local_314,local_314);
  uStack_b0 = CONCAT44(local_314,local_314);
  local_110 = in_RDX + 4;
  local_118 = in_RDX + 6;
  local_100 = &local_398;
  local_108 = &local_3a8;
  local_d0 = &local_128;
  uVar1 = *local_110;
  uVar2 = in_RDX[5];
  local_c8._0_4_ = (float)uVar1;
  local_c8._4_4_ = (float)((ulong)uVar1 >> 0x20);
  uStack_c0._0_4_ = (float)uVar2;
  uStack_c0._4_4_ = (float)((ulong)uVar2 >> 0x20);
  local_a8 = local_314 * (float)local_c8;
  fStack_a4 = local_314 * local_c8._4_4_;
  fStack_a0 = local_314 * (float)uStack_c0;
  fStack_9c = local_314 * uStack_c0._4_4_;
  local_90 = &local_128;
  local_58 = CONCAT44(fStack_a4,local_a8);
  uStack_50 = CONCAT44(fStack_9c,fStack_a0);
  local_e8 = &local_398;
  local_f0 = &local_128;
  uVar3 = *local_118;
  uVar4 = in_RDX[7];
  local_68._0_4_ = (float)uVar3;
  local_68._4_4_ = (float)((ulong)uVar3 >> 0x20);
  uStack_60._0_4_ = (float)uVar4;
  uStack_60._4_4_ = (float)((ulong)uVar4 >> 0x20);
  local_88 = local_a8 + (float)local_68;
  fStack_84 = fStack_a4 + local_68._4_4_;
  fStack_80 = fStack_a0 + (float)uStack_60;
  fStack_7c = fStack_9c + uStack_60._4_4_;
  local_70 = &local_398;
  local_1c0 = &local_378;
  local_1c8 = &local_388;
  local_1d8 = &local_398;
  local_190 = &local_1e8;
  uVar5 = *local_1d0;
  uVar6 = in_RDX[3];
  local_188._0_4_ = (float)uVar5;
  local_188._4_4_ = (float)((ulong)uVar5 >> 0x20);
  uStack_180._0_4_ = (float)uVar6;
  uStack_180._4_4_ = (float)((ulong)uVar6 >> 0x20);
  local_168 = local_324 * (float)local_188;
  fStack_164 = local_324 * local_188._4_4_;
  fStack_160 = local_324 * (float)uStack_180;
  fStack_15c = local_324 * uStack_180._4_4_;
  local_150 = &local_1e8;
  local_38 = CONCAT44(fStack_164,local_168);
  uStack_30 = CONCAT44(fStack_15c,fStack_160);
  local_1a8 = &local_378;
  local_1b0 = &local_1e8;
  local_48 = (float)local_398;
  fStack_44 = (float)((ulong)local_398 >> 0x20);
  fStack_40 = (float)uStack_390;
  fStack_3c = (float)((ulong)uStack_390 >> 0x20);
  local_148 = local_168 + local_48;
  fStack_144 = fStack_164 + fStack_44;
  fStack_140 = fStack_160 + fStack_40;
  fStack_13c = fStack_15c + fStack_3c;
  local_130 = &local_378;
  local_280 = &stack0xfffffffffffffc28;
  local_288 = &local_368;
  local_298 = &local_378;
  local_250 = &local_2a8;
  uVar7 = *in_RDX;
  uVar8 = in_RDX[1];
  local_248._0_4_ = (float)uVar7;
  local_248._4_4_ = (float)((ulong)uVar7 >> 0x20);
  uStack_240._0_4_ = (float)uVar8;
  uStack_240._4_4_ = (float)((ulong)uVar8 >> 0x20);
  local_228 = local_334 * (float)local_248;
  fStack_224 = local_334 * local_248._4_4_;
  fStack_220 = local_334 * (float)uStack_240;
  fStack_21c = local_334 * uStack_240._4_4_;
  local_210 = &local_2a8;
  local_18 = CONCAT44(fStack_224,local_228);
  uStack_10 = CONCAT44(fStack_21c,fStack_220);
  local_268 = &stack0xfffffffffffffc28;
  local_270 = &local_2a8;
  local_28 = (float)local_378;
  fStack_24 = (float)((ulong)local_378 >> 0x20);
  fStack_20 = (float)uStack_370;
  fStack_1c = (float)((ulong)uStack_370 >> 0x20);
  local_208 = local_228 + local_28;
  fStack_204 = fStack_224 + fStack_24;
  fStack_200 = fStack_220 + fStack_20;
  fStack_1fc = fStack_21c + fStack_1c;
  local_1f0 = &stack0xfffffffffffffc28;
  local_308 = local_314;
  fStack_304 = local_314;
  fStack_300 = local_314;
  fStack_2fc = local_314;
  local_2f8 = local_314;
  local_2e8 = local_324;
  fStack_2e4 = local_324;
  fStack_2e0 = local_324;
  fStack_2dc = local_324;
  local_2cc = local_324;
  local_2c8 = local_334;
  fStack_2c4 = local_334;
  fStack_2c0 = local_334;
  fStack_2bc = local_334;
  local_2ac = local_334;
  local_278 = local_298;
  local_258 = local_288;
  local_248 = uVar7;
  uStack_240 = uVar8;
  local_1b8 = local_1d8;
  local_1a0 = local_1d0;
  local_198 = local_1c8;
  local_188 = uVar5;
  uStack_180 = uVar6;
  local_f8 = local_118;
  local_e0 = local_110;
  local_d8 = local_108;
  local_c8 = uVar1;
  uStack_c0 = uVar2;
  local_68 = uVar3;
  uStack_60 = uVar4;
  local_3a8 = local_b8;
  uStack_3a0 = uStack_b0;
  local_398 = CONCAT44(fStack_84,local_88);
  uStack_390 = CONCAT44(fStack_7c,fStack_80);
  local_388 = local_178;
  uStack_380 = uStack_170;
  local_378 = CONCAT44(fStack_144,local_148);
  uStack_370 = CONCAT44(fStack_13c,fStack_140);
  local_368 = local_238;
  uStack_360 = uStack_230;
  local_2a8 = local_18;
  uStack_2a0 = uStack_10;
  local_1e8 = local_38;
  uStack_1e0 = uStack_30;
  local_128 = local_58;
  uStack_120 = uStack_50;
  PointLight((PointLight *)CONCAT44(fStack_1fc,fStack_200),(Vec3fa *)CONCAT44(fStack_204,local_208),
             (Vec3fa *)in_RDI);
  return in_RDI;
}

Assistant:

PointLight transform(const AffineSpace3fa& space) const {
        return PointLight(xfmPoint(space,P),I);
      }